

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O2

string * __thiscall
supermap::SingleFileIndexedStorage<int,int,void>::getStorageFilePath_abi_cxx11_
          (string *__return_storage_ptr__,SingleFileIndexedStorage<int,int,void> *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,*(string **)(this + 0x20));
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string getStorageFilePath() const noexcept {
        return storageFile_->getPath();
    }